

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_iscal_patch_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *alpha
                    )

{
  void *in_RDX;
  Integer *in_RSI;
  Integer *in_RDI;
  Integer atype;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  Integer *in_stack_000001c8;
  Integer in_stack_000001d0;
  
  pnga_inquire_type(in_stack_000001d0,in_stack_000001c8);
  pnga_error(in_stack_00000170,in_stack_00000168);
  sga_scale_patch((Integer)jhi,alpha,(Integer *)atype,in_RDI,in_RSI,in_RDX);
  return;
}

Assistant:

void FATR ga_iscal_patch_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi, Integer *alpha)
{
    Integer atype;

    pnga_inquire_type(*g_a, &atype);
    if (atype != C_INT || atype != C_LONG || atype != C_LONGLONG)
        pnga_error(" wrong types ", 0L);
    sga_scale_patch(*g_a, ilo, ihi, jlo, jhi, alpha);
}